

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_8f4e27::Target::DumpInclude
          (Value *__return_storage_ptr__,Target *this,IncludeEntry *inc)

{
  Value *pVVar1;
  Value local_88;
  Value local_50;
  undefined1 local_21;
  IncludeEntry *local_20;
  IncludeEntry *inc_local;
  Target *this_local;
  Value *include;
  
  local_21 = 0;
  local_20 = inc;
  inc_local = (IncludeEntry *)this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_50,(string *)local_20);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(pVVar1,&local_50);
  Json::Value::~Value(&local_50);
  if ((local_20->IsSystem & 1U) != 0) {
    Json::Value::Value(&local_88,true);
    pVVar1 = Json::Value::operator[](__return_storage_ptr__,"isSystem");
    Json::Value::operator=(pVVar1,&local_88);
    Json::Value::~Value(&local_88);
  }
  AddBacktrace(this,__return_storage_ptr__,&(local_20->Path).Backtrace);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpInclude(CompileData::IncludeEntry const& inc)
{
  Json::Value include = Json::objectValue;
  include["path"] = inc.Path.Value;
  if (inc.IsSystem) {
    include["isSystem"] = true;
  }
  this->AddBacktrace(include, inc.Path.Backtrace);
  return include;
}